

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollarea.cpp
# Opt level: O2

void __thiscall QScrollAreaPrivate::updateWidgetPosition(QScrollAreaPrivate *this)

{
  Alignment alignment;
  QWidget *pQVar1;
  QWidgetData *pQVar2;
  QWidgetData *pQVar3;
  LayoutDirection direction;
  uint uVar4;
  uint uVar5;
  QSize QVar6;
  Representation ax;
  QWidget *this_00;
  Representation ay;
  long in_FS_OFFSET;
  QRect QVar7;
  QRect QVar8;
  QRect local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  direction = QWidget::layoutDirection
                        (*(QWidget **)
                          &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                           super_QWidgetPrivate.field_0x8);
  local_48 = QWidget::rect((this->super_QAbstractScrollAreaPrivate).viewport);
  uVar4 = QAbstractSlider::value
                    (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
  uVar5 = QAbstractSlider::value
                    (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider);
  QVar6 = QWidget::size((QWidget *)(this->widget).wp.value);
  local_58.x2.m_i = ~uVar4 + QVar6.wd.m_i.m_i;
  local_58.y1.m_i = -uVar5;
  local_58.x1.m_i = -uVar4;
  local_58.y2.m_i = ~uVar5 + QVar6.ht.m_i.m_i;
  QVar7 = QStyle::visualRect(direction,&local_48,&local_58);
  alignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i
       = (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
         (this->alignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
         super_QFlagsStorage<Qt::AlignmentFlag>.i;
  local_58._0_8_ = QWidget::size((QWidget *)(this->widget).wp.value);
  local_48 = QWidget::rect((this->super_QAbstractScrollAreaPrivate).viewport);
  QVar8 = QStyle::alignedRect(direction,alignment,(QSize *)&local_58,&local_48);
  pQVar1 = (QWidget *)(this->widget).wp.value;
  this_00 = (QWidget *)0x0;
  if (*(int *)((this->widget).wp.d + 4) != 0) {
    this_00 = pQVar1;
  }
  pQVar2 = pQVar1->data;
  pQVar3 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
  ax.m_i = QVar7.x1.m_i.m_i;
  if (((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1 <
      ((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + 1) {
    ax.m_i = QVar8.x1.m_i.m_i;
  }
  ay.m_i = QVar7.y1.m_i.m_i;
  if (((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i) + 1 <
      ((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) + 1) {
    ay.m_i = QVar8.y1.m_i.m_i;
  }
  QWidget::move(this_00,ax.m_i,ay.m_i);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollAreaPrivate::updateWidgetPosition()
{
    Q_Q(QScrollArea);
    Qt::LayoutDirection dir = q->layoutDirection();
    QRect scrolled = QStyle::visualRect(dir, viewport->rect(), QRect(QPoint(-hbar->value(), -vbar->value()), widget->size()));
    QRect aligned = QStyle::alignedRect(dir, alignment, widget->size(), viewport->rect());
    widget->move(widget->width() < viewport->width() ? aligned.x() : scrolled.x(),
                 widget->height() < viewport->height() ? aligned.y() : scrolled.y());
}